

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O3

void SpotLight_set(void *super,Vec3fa *position,Vec3fa *direction,Vec3fa *power,float cosAngleMax,
                  float cosAngleScale,float radius)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [12];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar12 [16];
  float fVar16;
  float fVar17;
  vfloat4 a;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  
  uVar3 = *(undefined8 *)((long)&position->field_0 + 8);
  *(undefined8 *)((long)super + 0x10) = *(undefined8 *)&position->field_0;
  *(undefined8 *)((long)super + 0x18) = uVar3;
  fVar5 = (direction->field_0).m128[0];
  fVar7 = (direction->field_0).m128[2];
  fVar6 = -(direction->field_0).m128[1];
  fVar9 = -fVar7;
  auVar8._8_4_ = 0xffffffff;
  auVar8._0_8_ = 0xffffffffffffffff;
  if (fVar6 * fVar6 + fVar7 * fVar7 + 0.0 <= fVar5 * fVar5 + fVar9 * fVar9 + 0.0) {
    auVar8 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar7 = (float)((uint)fVar7 & auVar8._4_4_);
  fVar9 = (float)(~auVar8._0_4_ & (uint)fVar9);
  fVar14 = (float)(~auVar8._8_4_ & (uint)fVar5 | (uint)fVar6 & auVar8._8_4_);
  fVar5 = fVar7 * fVar7;
  fVar6 = fVar14 * fVar14;
  fVar16 = fVar5 + fVar9 * fVar9 + fVar6;
  fVar17 = fVar5 + fVar5 + 0.0;
  fVar6 = fVar5 + fVar6 + fVar6;
  fVar5 = fVar5 + 0.0 + 0.0;
  auVar18._4_4_ = fVar17;
  auVar18._0_4_ = fVar16;
  auVar18._8_4_ = fVar6;
  auVar18._12_4_ = fVar5;
  auVar1._4_4_ = fVar17;
  auVar1._0_4_ = fVar16;
  auVar1._8_4_ = fVar6;
  auVar1._12_4_ = fVar5;
  auVar19 = rsqrtss(auVar18,auVar1);
  fVar5 = auVar19._0_4_;
  fVar10 = fVar5 * 1.5 - fVar5 * fVar5 * fVar16 * 0.5 * fVar5;
  fVar9 = fVar10 * fVar9;
  fVar7 = fVar10 * fVar7;
  fVar14 = fVar10 * fVar14;
  fVar10 = fVar10 * 0.0;
  fVar5 = (direction->field_0).m128[0];
  fVar6 = (direction->field_0).m128[1];
  fVar16 = (direction->field_0).m128[2];
  fVar17 = (direction->field_0).m128[3];
  *(float *)((long)super + 0x20) = fVar9;
  *(float *)((long)super + 0x24) = fVar7;
  *(float *)((long)super + 0x28) = fVar14;
  *(float *)((long)super + 0x2c) = fVar10;
  fVar11 = fVar7 * fVar5 - fVar6 * fVar9;
  fVar13 = fVar14 * fVar6 - fVar16 * fVar7;
  fVar9 = fVar9 * fVar16 - fVar5 * fVar14;
  fVar10 = fVar10 * fVar17 - fVar17 * fVar10;
  fVar7 = fVar13 * fVar13;
  fVar14 = fVar9 * fVar9;
  fVar15 = fVar10 * fVar10;
  fVar20 = fVar14 + fVar7 + fVar11 * fVar11;
  fVar21 = fVar15 + fVar7 + fVar7;
  fVar14 = fVar14 + fVar7 + fVar14;
  fVar15 = fVar15 + fVar7 + fVar15;
  auVar12._4_4_ = fVar21;
  auVar12._0_4_ = fVar20;
  auVar12._8_4_ = fVar14;
  auVar12._12_4_ = fVar15;
  auVar2._4_4_ = fVar21;
  auVar2._0_4_ = fVar20;
  auVar2._8_4_ = fVar14;
  auVar2._12_4_ = fVar15;
  auVar19 = rsqrtss(auVar12,auVar2);
  fVar7 = auVar19._0_4_;
  fVar7 = fVar7 * 1.5 - fVar7 * fVar7 * fVar20 * 0.5 * fVar7;
  *(float *)((long)super + 0x30) = fVar7 * fVar13;
  *(float *)((long)super + 0x34) = fVar7 * fVar9;
  *(float *)((long)super + 0x38) = fVar7 * fVar11;
  *(float *)((long)super + 0x3c) = fVar7 * fVar10;
  *(float *)((long)super + 0x40) = fVar5;
  *(float *)((long)super + 0x44) = fVar6;
  *(float *)((long)super + 0x48) = fVar16;
  *(float *)((long)super + 0x4c) = fVar17;
  uVar3 = *(undefined8 *)((long)&power->field_0 + 8);
  *(undefined8 *)((long)super + 0x50) = *(undefined8 *)&power->field_0;
  *(undefined8 *)((long)super + 0x58) = uVar3;
  *(float *)((long)super + 0x60) = cosAngleMax;
  *(float *)((long)super + 100) = cosAngleScale;
  *(float *)((long)super + 0x68) = radius;
  fVar5 = radius * radius * 3.1415927;
  auVar4._4_4_ = in_XMM2_Db;
  auVar4._0_4_ = fVar5;
  auVar4._8_4_ = in_XMM2_Dc;
  auVar4._12_4_ = in_XMM2_Dd;
  auVar19._4_4_ = in_XMM2_Db;
  auVar19._0_4_ = fVar5;
  auVar19._8_4_ = in_XMM2_Dc;
  auVar19._12_4_ = in_XMM2_Dd;
  auVar19 = rcpss(auVar4,auVar19);
  *(float *)((long)super + 0x6c) = (2.0 - fVar5 * auVar19._0_4_) * auVar19._0_4_;
  return;
}

Assistant:

__forceinline          Vec3fa( const float x, const float y, const float z) : m128(_mm_set_ps(0, z, y, x)) {}